

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_check_ip_acl(char *acl,uint32_t remote_ip)

{
  char cVar1;
  int iVar2;
  char *list;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int *piVar6;
  uint local_58;
  int d;
  int c;
  int b;
  int a;
  int n;
  mg_str vec;
  
  if (acl == (char *)0x0) {
    iVar5 = 0x2b;
  }
  else {
    iVar5 = (uint)(*acl != '\0') * 2 + 0x2b;
  }
  list = mg_next_comma_list_entry(acl,&vec,(mg_str *)0x0);
  while( true ) {
    if (list == (char *)0x0) {
      return (uint)(iVar5 == 0x2b);
    }
    cVar1 = *vec.p;
    if ((cVar1 != '-') && (cVar1 != '+')) {
      return -1;
    }
    pcVar4 = vec.p + 1;
    local_58 = 0x20;
    piVar6 = &n;
    iVar2 = __isoc99_sscanf(pcVar4,"%d.%d.%d.%d/%d%n",&a,&b,&c,&d,&local_58,piVar6);
    if ((iVar2 != 5) &&
       (iVar2 = __isoc99_sscanf(pcVar4,"%d.%d.%d.%d%n",&a,&b,&c,&d,&n,piVar6), iVar2 != 4)) {
      return -1;
    }
    if (0xff < (uint)a) {
      return -1;
    }
    if (0xff < (uint)b) {
      return -1;
    }
    if (0xff < (uint)c) {
      return -1;
    }
    if (0xff < (uint)d) {
      return -1;
    }
    if (0x20 < local_58) {
      return -1;
    }
    if (n == 0) break;
    uVar3 = -1 << (-(char)local_58 & 0x1fU);
    if (local_58 == 0) {
      uVar3 = 0;
    }
    if ((c << 8 | d | a << 0x18 | b << 0x10) == (uVar3 & remote_ip)) {
      iVar5 = (int)cVar1;
    }
    list = mg_next_comma_list_entry(list,&vec,(mg_str *)0x0);
  }
  return -1;
}

Assistant:

int mg_check_ip_acl(const char *acl, uint32_t remote_ip) {
    int allowed, flag;
    uint32_t net, mask;
    struct mg_str vec;

    /* If any ACL is set, deny by default */
    allowed = (acl == NULL || *acl == '\0') ? '+' : '-';

    while ((acl = mg_next_comma_list_entry(acl, &vec, NULL)) != NULL) {
        flag = vec.p[0];
        if ((flag != '+' && flag != '-') ||
            parse_net(&vec.p[1], &net, &mask) == 0) {
            return -1;
        }

        if (net == (remote_ip & mask)) {
            allowed = flag;
        }
    }

    return allowed == '+';
}